

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void connectDebugSignals(shared_ptr<gui::MenuBar> *menuBar,string *name)

{
  shared_ptr<gui::Widget> local_18;
  
  local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_Widget;
  if ((element_type *)local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  connectDebugSignals(&local_18,name);
  if (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMousePress,mousePress);
  gui::Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Mouse::Button,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMouseRelease,mouseRelease);
  gui::Signal<gui::Widget*,sf::Vector2<float>const&>::
  connect<void(&)(gui::Widget*,sf::Vector2<float>const&)>
            ((Signal<gui::Widget*,sf::Vector2<float>const&> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onClick,click);
  gui::Signal<gui::Widget*,gui::MenuList_const&,unsigned_long>::
  connect<void(&)(gui::Widget*,gui::MenuList_const&,unsigned_long)>
            ((Signal<gui::Widget*,gui::MenuList_const&,unsigned_long> *)
             &((menuBar->super___shared_ptr<gui::MenuBar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              onMenuItemClick,menuItemClick);
  return;
}

Assistant:

void connectDebugSignals(const std::shared_ptr<gui::MenuBar>& menuBar, const std::string& name) {
    connectDebugSignals(std::dynamic_pointer_cast<gui::Widget>(menuBar), name);
    menuBar->onMousePress.connect(mousePress);
    menuBar->onMouseRelease.connect(mouseRelease);
    menuBar->onClick.connect(click);
    menuBar->onMenuItemClick.connect(menuItemClick);
}